

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O2

obj * get_mleash(monst *mtmp)

{
  obj **ppoVar1;
  
  ppoVar1 = &invent;
  do {
    ppoVar1 = &((obj *)ppoVar1)->nobj->nobj;
    if ((obj *)ppoVar1 == (obj *)0x0) {
      return (obj *)ppoVar1;
    }
  } while ((((obj *)ppoVar1)->otyp != 0xf1) || (((obj *)ppoVar1)->corpsenm != mtmp->m_id));
  return (obj *)ppoVar1;
}

Assistant:

struct obj *get_mleash(struct monst *mtmp)	/* assuming mtmp->mleashed has been checked */
{
	struct obj *otmp;

	otmp = invent;
	while (otmp) {
		if (otmp->otyp == LEASH && otmp->leashmon == (int)mtmp->m_id)
			return otmp;
		otmp = otmp->nobj;
	}
	return NULL;
}